

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::BasicTexImage2DCase::createTexture(BasicTexImage2DCase *this)

{
  ContextWrapper *this_00;
  float fVar1;
  float fVar2;
  uint uVar3;
  deUint32 type;
  int i;
  uint uVar4;
  deUint32 dVar5;
  int width;
  long lVar6;
  uint uVar7;
  int ndx;
  int height;
  int level;
  float fVar8;
  int local_f0;
  deUint32 tex;
  Vec4 gMax;
  TextureFormat fmt;
  Vec4 gMin;
  PixelBufferAccess local_a8;
  float afStack_78 [4];
  Random rnd;
  TextureLevel levelData;
  
  fmt = (this->super_TextureSpecCase).m_texFormat;
  local_f0 = 1;
  if (((this->super_TextureSpecCase).m_flags & 1) != 0) {
    uVar3 = (this->super_TextureSpecCase).m_width;
    uVar4 = 0x20;
    uVar7 = 0x20;
    if (uVar3 != 0) {
      uVar7 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> uVar7 == 0; uVar7 = uVar7 - 1) {
        }
      }
      uVar7 = uVar7 ^ 0x1f;
    }
    uVar3 = (this->super_TextureSpecCase).m_height;
    if (uVar3 != 0) {
      uVar4 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> uVar4 == 0; uVar4 = uVar4 - 1) {
        }
      }
      uVar4 = uVar4 ^ 0x1f;
    }
    local_f0 = 0x1f - uVar4;
    if ((int)(0x1f - uVar4) < (int)(0x1f - uVar7)) {
      local_f0 = 0x1f - uVar7;
    }
    local_f0 = local_f0 + 1;
  }
  tex = 0;
  tcu::TextureLevel::TextureLevel(&levelData,&fmt);
  dVar5 = deStringHash((this->super_TextureSpecCase).super_TestCase.super_TestCase.super_TestNode.
                       m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar5);
  this_00 = &(this->super_TextureSpecCase).super_ContextWrapper;
  sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
  sglr::ContextWrapper::glBindTexture(this_00,0xde1,tex);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,1);
  if (0 < local_f0) {
    level = 0;
    do {
      height = (this->super_TextureSpecCase).m_height >> ((byte)level & 0x1f);
      local_a8.super_ConstPixelBufferAccess.m_format.order = R;
      local_a8.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
      local_a8.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
      local_a8.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
      width = (this->super_TextureSpecCase).m_width >> ((byte)level & 0x1f);
      if (width < 2) {
        width = 1;
      }
      lVar6 = 0;
      do {
        gMax.m_data[lVar6] = 1.0;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 4);
      if (height < 2) {
        height = 1;
      }
      gMin.m_data[0] = 0.0;
      gMin.m_data[1] = 0.0;
      gMin.m_data[2] = 0.0;
      gMin.m_data[3] = 0.0;
      lVar6 = 0;
      do {
        fVar1 = (float)local_a8.super_ConstPixelBufferAccess.m_size.m_data[lVar6 + -2];
        fVar2 = gMax.m_data[lVar6];
        fVar8 = deRandom_getFloat(&rnd.m_rnd);
        gMin.m_data[lVar6] = (fVar2 - fVar1) * fVar8 + fVar1;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 4);
      local_a8.super_ConstPixelBufferAccess.m_format.order = R;
      local_a8.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
      local_a8.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
      local_a8.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
      lVar6 = 0;
      do {
        afStack_78[lVar6] = 1.0;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 4);
      gMax.m_data[0] = 0.0;
      gMax.m_data[1] = 0.0;
      gMax.m_data[2] = 0.0;
      gMax.m_data[3] = 0.0;
      lVar6 = 0;
      do {
        fVar1 = (float)local_a8.super_ConstPixelBufferAccess.m_size.m_data[lVar6 + -2];
        fVar2 = afStack_78[lVar6];
        fVar8 = deRandom_getFloat(&rnd.m_rnd);
        gMax.m_data[lVar6] = (fVar2 - fVar1) * fVar8 + fVar1;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 4);
      tcu::TextureLevel::setSize(&levelData,width,height,1);
      tcu::TextureLevel::getAccess(&local_a8,&levelData);
      tcu::fillWithComponentGradients(&local_a8,&gMin,&gMax);
      dVar5 = this->m_format;
      type = this->m_dataType;
      tcu::TextureLevel::getAccess(&local_a8,&levelData);
      sglr::ContextWrapper::glTexImage2D
                (this_00,0xde1,level,dVar5,width,height,0,dVar5,type,
                 local_a8.super_ConstPixelBufferAccess.m_data);
      level = level + 1;
    } while (level != local_f0);
  }
  tcu::TextureLevel::~TextureLevel(&levelData);
  return;
}

Assistant:

void createTexture (void)
	{
		tcu::TextureFormat	fmt			= m_texFormat;
		int					numLevels	= (m_flags & MIPMAPS) ? de::max(deLog2Floor32(m_width), deLog2Floor32(m_height))+1 : 1;
		deUint32			tex			= 0;
		tcu::TextureLevel	levelData	(fmt);
		de::Random			rnd			(deStringHash(getName()));

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_2D, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

		for (int ndx = 0; ndx < numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width >> ndx);
			int		levelH		= de::max(1, m_height >> ndx);
			Vec4	gMin		= randomVector<4>(rnd);
			Vec4	gMax		= randomVector<4>(rnd);

			levelData.setSize(levelW, levelH);
			tcu::fillWithComponentGradients(levelData.getAccess(), gMin, gMax);

			glTexImage2D(GL_TEXTURE_2D, ndx, m_format, levelW, levelH, 0, m_format, m_dataType, levelData.getAccess().getDataPtr());
		}
	}